

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::PropertySymOpnd::ChangesObjectLayout(PropertySymOpnd *this)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 uVar4;
  TypeId TVar5;
  JITType *pJVar6;
  undefined4 *puVar7;
  JITTypeHandler *pJVar8;
  nullptr_t local_30;
  JITTypeHolderBase<void> local_28;
  JITTypeHolder finalType;
  JITTypeHolder initialType;
  JITTypeHolder cachedType;
  
  bVar2 = HasInitialType(this);
  if (bVar2) {
    initialType = GetInitialType(this);
  }
  else if ((this->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
          (bVar2 = ObjTypeSpecFldInfo::IsMono(this->objTypeSpecFldInfo), !bVar2)) {
    initialType = GetFirstEquivalentType(this);
  }
  else {
    initialType = GetType(this);
  }
  local_28.t = (this->finalType).t;
  finalType.t = (Type)0x0;
  bVar2 = JITTypeHolderBase<void>::operator!=(&local_28,&finalType.t);
  if (!bVar2) {
LAB_00616823:
    bVar2 = HasInitialType(this);
    if (bVar2) {
      finalType = GetInitialType(this);
      local_30 = (nullptr_t)0x0;
      bVar2 = JITTypeHolderBase<void>::operator!=(&finalType,&local_30);
      if (bVar2) {
        pJVar6 = JITTypeHolderBase<void>::operator->(&finalType);
        TVar5 = JITType::GetTypeId(pJVar6);
        bVar2 = Js::DynamicType::Is(TVar5);
        if (bVar2) {
          pJVar6 = JITTypeHolderBase<void>::operator->(&finalType);
          pJVar8 = JITType::GetTypeHandler(pJVar6);
          bVar2 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar8);
          return bVar2;
        }
      }
    }
    return false;
  }
  pJVar6 = JITTypeHolderBase<void>::operator->(&local_28);
  TVar5 = JITType::GetTypeId(pJVar6);
  bVar2 = Js::DynamicType::Is(TVar5);
  if (!bVar2) goto LAB_00616823;
  finalType.t = (Type)0x0;
  bVar2 = JITTypeHolderBase<void>::operator!=(&initialType,&finalType.t);
  if (bVar2) {
    pJVar6 = JITTypeHolderBase<void>::operator->(&initialType);
    TVar5 = JITType::GetTypeId(pJVar6);
    bVar2 = Js::DynamicType::Is(TVar5);
    if (bVar2) goto LAB_006167a6;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                     ,0x3ce,
                     "(cachedType != nullptr && Js::DynamicType::Is(cachedType->GetTypeId()))",
                     "cachedType != nullptr && Js::DynamicType::Is(cachedType->GetTypeId())");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar7 = 0;
LAB_006167a6:
  pJVar6 = JITTypeHolderBase<void>::operator->(&initialType);
  pJVar8 = JITType::GetTypeHandler(pJVar6);
  uVar3 = JITTypeHandler::GetInlineSlotCapacity(pJVar8);
  pJVar6 = JITTypeHolderBase<void>::operator->(&local_28);
  pJVar8 = JITType::GetTypeHandler(pJVar6);
  uVar4 = JITTypeHandler::GetInlineSlotCapacity(pJVar8);
  if (uVar3 != uVar4) {
    return true;
  }
  pJVar6 = JITTypeHolderBase<void>::operator->(&initialType);
  pJVar8 = JITType::GetTypeHandler(pJVar6);
  uVar3 = JITTypeHandler::GetOffsetOfInlineSlots(pJVar8);
  pJVar6 = JITTypeHolderBase<void>::operator->(&local_28);
  pJVar8 = JITType::GetTypeHandler(pJVar6);
  uVar4 = JITTypeHandler::GetOffsetOfInlineSlots(pJVar8);
  return uVar3 != uVar4;
}

Assistant:

bool
PropertySymOpnd::ChangesObjectLayout() const
{
    JITTypeHolder cachedType = this->HasInitialType() ? this->GetInitialType() : 
        this->IsMono() ? this->GetType() : this->GetFirstEquivalentType();

    JITTypeHolder finalType = this->GetFinalType();

    if (finalType != nullptr && Js::DynamicType::Is(finalType->GetTypeId()))
    {
        // This is the case where final type opt may cause pro-active type transition to take place.

    Assert(cachedType != nullptr && Js::DynamicType::Is(cachedType->GetTypeId()));

    return cachedType->GetTypeHandler()->GetInlineSlotCapacity() != finalType->GetTypeHandler()->GetInlineSlotCapacity() ||
        cachedType->GetTypeHandler()->GetOffsetOfInlineSlots() != finalType->GetTypeHandler()->GetOffsetOfInlineSlots();
    }

    if (!this->HasInitialType())
    {
        return false;
    }

    JITTypeHolder initialType = this->GetInitialType();
    if (initialType != nullptr && Js::DynamicType::Is(initialType->GetTypeId()))
    {
        // This is the case where the type transition actually occurs. (This is the only case that's detectable
        // during the loop pre-pass, since final types are not in place yet.)

        const JITTypeHandler * initialTypeHandler = initialType->GetTypeHandler();

        // If no final type has been set in the forward pass, then we have no way of knowing how the object shape will evolve here.
        // If the initial type is object-header-inlined, assume that the layout may change.
        return initialTypeHandler->IsObjectHeaderInlinedTypeHandler();
    }

    return false;
}